

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

void RegisterMiningRPCCommands(CRPCTable *t)

{
  int iVar1;
  long in_FS_OFFSET;
  CRPCCommand *c;
  CRPCCommand *__end1;
  CRPCCommand *__begin1;
  CRPCCommand (*__range1) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  CRPCTable *in_stack_fffffffffffffde8;
  CRPCCommand *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  string *category;
  CRPCCommand *in_stack_fffffffffffffe08;
  CRPCCommand *this;
  allocator<char> *in_stack_fffffffffffffe18;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe20;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CRPCCommand *local_1a8;
  allocator<char> local_173;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170 [2];
  allocator<char> local_16e;
  allocator<char> local_16d;
  undefined1 local_16c [2];
  allocator<char> local_16a;
  allocator<char> local_169 [353];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterMiningRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterMiningRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      __s = &local_16d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)__s,in_stack_fffffffffffffe18);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      __a = &local_16e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (RpcMethodFnType)in_stack_fffffffffffffdf8);
      this = (CRPCCommand *)local_170;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand
                (this,in_stack_fffffffffffffe00,(RpcMethodFnType)in_stack_fffffffffffffdf8);
      category = (string *)&local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffdf8);
      in_stack_fffffffffffffdf8 = (CRPCCommand *)&local_172;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffdf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
      CRPCCommand::CRPCCommand(this,category,(RpcMethodFnType)in_stack_fffffffffffffdf8);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator(&local_173);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_172);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)local_170);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)(local_170 + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator(&local_16e);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator(&local_16d);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)local_16c);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)(local_16c + 1));
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator(&local_16a);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
      std::allocator<char>::~allocator(local_169);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterMiningRPCCommands(CRPCTable&)::commands);
    }
  }
  for (local_1a8 = RegisterMiningRPCCommands::commands;
      local_1a8 != (CRPCCommand *)&RegisterMiningRPCCommands(CRPCTable&)::commands;
      local_1a8 = local_1a8 + 1) {
    CRPCTable::appendCommand
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdf8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterMiningRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"mining", &getnetworkhashps},
        {"mining", &getmininginfo},
        {"mining", &prioritisetransaction},
        {"mining", &getprioritisedtransactions},
        {"mining", &getblocktemplate},
        {"mining", &submitblock},
        {"mining", &submitheader},

        {"hidden", &generatetoaddress},
        {"hidden", &generatetodescriptor},
        {"hidden", &generateblock},
        {"hidden", &generate},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}